

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Func.h
# Opt level: O1

bool __thiscall Func::CanOptimizeTryFinally(Func *this)

{
  bool bVar1;
  uint sourceContextId;
  uint functionId;
  JITTimeFunctionBody *pJVar2;
  FunctionJITTimeInfo *this_00;
  JITTimeProfileInfo *this_01;
  
  bVar1 = JITTimeWorkItem::IsLoopBody(this->m_workItem);
  if (!bVar1) {
    pJVar2 = JITTimeWorkItem::GetJITFunctionBody(this->m_workItem);
    sourceContextId = JITTimeFunctionBody::GetSourceContextId(pJVar2);
    this_00 = JITTimeWorkItem::GetJITTimeInfo(this->m_workItem);
    functionId = FunctionJITTimeInfo::GetLocalFunctionId(this_00);
    bVar1 = Js::Phases::IsEnabled
                      ((Phases *)&DAT_015bbe90,OptimizeTryFinallyPhase,sourceContextId,functionId);
    if (!bVar1) {
      pJVar2 = JITTimeWorkItem::GetJITFunctionBody(this->m_workItem);
      bVar1 = JITTimeFunctionBody::HasProfileInfo(pJVar2);
      if (!bVar1) {
        return true;
      }
      pJVar2 = JITTimeWorkItem::GetJITFunctionBody(this->m_workItem);
      this_01 = JITTimeFunctionBody::GetReadOnlyProfileInfo(pJVar2);
      bVar1 = JITTimeProfileInfo::IsOptimizeTryFinallyDisabled(this_01);
      return !bVar1;
    }
  }
  return false;
}

Assistant:

bool CanOptimizeTryFinally() const
    {
        return !this->m_workItem->IsLoopBody() && !PHASE_OFF(Js::OptimizeTryFinallyPhase, this) &&
            (!this->HasProfileInfo() || !this->GetReadOnlyProfileInfo()->IsOptimizeTryFinallyDisabled());
    }